

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

int32_t __thiscall helics::PublicationInfo::getProperty(PublicationInfo *this,int32_t option)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = 0;
  switch(option) {
  case 0x192:
    bVar3 = this->required ^ 1;
    break;
  case 0x193:
  case 0x194:
  case 0x195:
  case 0x196:
  case 0x198:
  case 0x19a:
    break;
  case 0x197:
    bVar3 = this->requiredConnections == 1;
    break;
  case 0x199:
    bVar3 = this->requiredConnections != 1;
    break;
  case 0x19b:
    bVar3 = this->buffer_data;
    break;
  default:
    if (option != 0x18d) {
      if (option == 0x22d) {
        lVar1 = (this->minTimeGap).internalTimeCode;
        lVar2 = 1000000;
      }
      else {
        if (option != 0x20a) {
          bVar3 = 0;
          if (option == 0x1c4) {
            bVar3 = this->only_update_on_change;
          }
          break;
        }
        lVar1 = (long)(this->subscribers).
                      super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->subscribers).
                      super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        lVar2 = 0x28;
      }
      return (int32_t)(lVar1 / lVar2);
    }
    bVar3 = this->required;
  }
  return (int32_t)bVar3;
}

Assistant:

int32_t PublicationInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            flagval = only_update_on_change;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (requiredConnections == 1);
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = requiredConnections != 1;
            break;
        case defs::Options::BUFFER_DATA:
            flagval = buffer_data;
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(subscribers.size());
        case defs::Options::TIME_RESTRICTED:
            return static_cast<std::int32_t>(minTimeGap.to_ms().count());
        default:
            break;
    }
    return flagval ? 1 : 0;
}